

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int VP8EncTokenLoop(VP8Encoder *enc)

{
  VP8EncProba *proba;
  VP8TBuffer *b;
  int iVar1;
  VP8RDLevel rd_opt;
  int iVar2;
  long lVar3;
  bool bVar4;
  VP8Encoder *enc_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  VP8Encoder *enc_1;
  ulong uVar10;
  size_t sVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int16_t (*paiVar15) [16];
  int16_t (*paiVar16) [16];
  long lVar17;
  uint ok;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  VP8Residual res;
  VP8ModeScore info;
  VP8EncIterator it;
  int local_13b4;
  PassStats local_1310;
  VP8Residual local_12d8;
  VP8ModeScore local_12a8;
  VP8EncIterator local_f38;
  
  iVar12 = enc->mb_w;
  iVar9 = enc->mb_h;
  iVar8 = ((VP8Encoder *)enc->config)->num_parts;
  iVar1 = enc->do_search;
  rd_opt = enc->rd_opt_level;
  InitPassStats((VP8Encoder *)enc->config,&local_1310);
  iVar6 = PreLoopInitialize(enc);
  if (iVar6 == 0) {
    iVar12 = 0;
  }
  else {
    proba = &enc->proba;
    iVar7 = iVar9 * iVar12 >> 3;
    iVar6 = 0x60;
    if (0x60 < iVar7) {
      iVar6 = iVar7;
    }
    if (iVar8 < 1) {
      local_13b4 = 0x28;
    }
    else {
      lVar3 = (long)iVar12 * (long)iVar9 * 0x180;
      b = &enc->tokens;
      auVar28._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar28._0_8_ = lVar3;
      auVar28._12_4_ = 0x45300000;
      local_13b4 = 0x28;
      do {
        iVar12 = iVar8 + -1;
        bVar25 = true;
        if ((0.4 < ABS(local_1310.dq)) && (iVar12 != 0)) {
          bVar25 = enc->max_i4_header_bits == 0;
        }
        iVar9 = local_13b4 / (iVar8 + 1);
        VP8IteratorInit(enc,&local_f38);
        SetLoopParams(enc,local_1310.q);
        if (bVar25) {
          memset((enc->proba).stats,0,0x1080);
          VP8InitFilter(&local_f38);
        }
        local_13b4 = local_13b4 - iVar9;
        VP8TBufferClear(b);
        lVar22 = 0;
        lVar17 = 0;
        iVar7 = iVar6;
        do {
          VP8IteratorImport(&local_f38,(uint8_t *)0x0);
          if (iVar7 < 1) {
            FinalizeTokenProbas(proba);
            VP8CalculateLevelCosts(proba);
            iVar7 = iVar6;
          }
          else {
            iVar7 = iVar7 + -1;
          }
          VP8Decimate(&local_f38,&local_12a8,rd_opt);
          enc_00 = local_f38.enc;
          VP8IteratorNzToBytes(&local_f38);
          bVar26 = ((uint)*local_f38.mb & 3) != 1;
          if (bVar26) {
            iVar14 = 3;
          }
          else {
            iVar14 = local_f38.left_nz[8] + local_f38.top_nz[8];
            VP8InitResidual(0,1,enc_00,&local_12d8);
            (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,&local_12d8);
            local_f38.top_nz[8] = VP8RecordCoeffTokens(iVar14,&local_12d8,b);
            iVar14 = 0;
            local_f38.left_nz[8] = local_f38.top_nz[8];
          }
          VP8InitResidual((uint)!bVar26,iVar14,enc_00,&local_12d8);
          paiVar15 = local_12a8.y_ac_levels;
          lVar23 = 0;
          do {
            lVar21 = 0x21;
            paiVar16 = paiVar15;
            do {
              iVar14 = local_f38.left_nz[lVar23];
              iVar2 = *(int *)(local_f38.i4_boundary + lVar21 * 4 + -0x50);
              (*VP8SetResidualCoeffs)(*paiVar16,&local_12d8);
              iVar14 = VP8RecordCoeffTokens(iVar14 + iVar2,&local_12d8,b);
              local_f38.left_nz[lVar23] = iVar14;
              *(int *)(local_f38.i4_boundary + lVar21 * 4 + -0x50) = iVar14;
              lVar21 = lVar21 + 1;
              paiVar16 = paiVar16 + 1;
            } while (lVar21 != 0x25);
            lVar23 = lVar23 + 1;
            paiVar15 = paiVar15 + 4;
          } while (lVar23 != 4);
          VP8InitResidual(0,2,enc_00,&local_12d8);
          uVar13 = 0;
          bVar26 = true;
          do {
            bVar4 = bVar26;
            uVar18 = 0;
            bVar26 = true;
            do {
              bVar5 = bVar26;
              uVar10 = uVar18 | uVar13 | 4;
              iVar14 = local_f38.left_nz[uVar10];
              uVar19 = 0;
              bVar26 = true;
              do {
                bVar20 = bVar26;
                uVar24 = uVar19 | uVar13 | 4;
                iVar2 = local_f38.top_nz[uVar24];
                (*VP8SetResidualCoeffs)
                          (local_12a8.uv_levels[uVar19 | (uVar18 | uVar13) * 2],&local_12d8);
                iVar14 = VP8RecordCoeffTokens(iVar14 + iVar2,&local_12d8,b);
                local_f38.left_nz[uVar10] = iVar14;
                local_f38.top_nz[uVar24] = iVar14;
                uVar19 = 1;
                bVar26 = false;
              } while (bVar20);
              uVar18 = 1;
              bVar26 = false;
            } while (bVar5);
            uVar13 = 2;
          } while (bVar4);
          VP8IteratorBytesToNz(&local_f38);
          if ((enc->tokens).error != 0) {
            WebPEncodingSetError(enc->pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
            goto LAB_00133a1f;
          }
          lVar22 = lVar22 + local_12a8.H;
          lVar17 = lVar17 + local_12a8.D;
          if (bVar25) {
            StoreSideInfo(&local_f38);
            VP8StoreFilterStats(&local_f38);
            VP8IteratorExport(&local_f38);
            iVar14 = VP8IteratorProgress(&local_f38,iVar9);
            VP8IteratorSaveBoundary(&local_f38);
            if (iVar14 == 0) goto LAB_00133a1f;
          }
          else {
            VP8IteratorSaveBoundary(&local_f38);
          }
          iVar14 = VP8IteratorNext(&local_f38);
        } while (iVar14 != 0);
        uVar13 = lVar22 + (enc->segment_hdr).size;
        if (local_1310.do_size_search == 0) {
          dVar27 = 99.0;
          if (lVar17 != 0 && lVar3 != 0) {
            auVar29._8_4_ = (int)((ulong)lVar17 >> 0x20);
            auVar29._0_8_ = lVar17;
            auVar29._12_4_ = 0x45300000;
            dVar27 = log10((((auVar28._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
                           65025.0) /
                           ((auVar29._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)));
            dVar27 = dVar27 * 10.0;
          }
        }
        else {
          iVar9 = FinalizeTokenProbas(proba);
          sVar11 = VP8EstimateTokenSize(b,(uint8_t *)(enc->proba).coeffs);
          dVar27 = (double)((sVar11 + (long)iVar9 + uVar13 + 0x400 >> 0xb) + 0x1e);
        }
        local_1310.value = dVar27;
        if ((enc->max_i4_header_bits < 1) || (uVar13 < 0x3fc00001)) {
          if (bVar25) break;
          iVar8 = iVar12;
          if (iVar1 != 0) {
            ComputeNextQ(&local_1310);
          }
        }
        else {
          enc->max_i4_header_bits = (uint)enc->max_i4_header_bits >> 1;
          if (bVar25) {
            if ((local_f38.enc)->pic->stats != (WebPAuxStats *)0x0) {
              (local_f38.enc)->block_count[2] = 0;
              (local_f38.enc)->block_count[0] = 0;
              (local_f38.enc)->block_count[1] = 0;
            }
            (local_f38.enc)->sse_count = 0;
            (local_f38.enc)->sse[0] = 0;
            (local_f38.enc)->sse[1] = 0;
            (local_f38.enc)->sse[2] = 0;
          }
        }
      } while (0 < iVar8);
    }
    if (local_1310.do_size_search == 0) {
      FinalizeTokenProbas(proba);
    }
    iVar12 = VP8EmitTokens(&enc->tokens,enc->parts,(uint8_t *)(enc->proba).coeffs,1);
    if (iVar12 == 0) {
LAB_00133a1f:
      ok = 0;
    }
    else {
      iVar12 = WebPReportProgress(enc->pic,local_13b4 + enc->percent,&enc->percent);
      ok = (uint)(iVar12 != 0);
    }
    iVar12 = PostLoopFinalize(&local_f38,ok);
  }
  return iVar12;
}

Assistant:

int VP8EncTokenLoop(VP8Encoder* const enc) {
  // Roughly refresh the proba eight times per pass
  int max_count = (enc->mb_w * enc->mb_h) >> 3;
  int num_pass_left = enc->config->pass;
  int remaining_progress = 40;  // percents
  const int do_search = enc->do_search;
  VP8EncIterator it;
  VP8EncProba* const proba = &enc->proba;
  const VP8RDLevel rd_opt = enc->rd_opt_level;
  const uint64_t pixel_count = (uint64_t)enc->mb_w * enc->mb_h * 384;
  PassStats stats;
  int ok;

  InitPassStats(enc, &stats);
  ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  if (max_count < MIN_COUNT) max_count = MIN_COUNT;

  assert(enc->num_parts == 1);
  assert(enc->use_tokens);
  assert(proba->use_skip_proba == 0);
  assert(rd_opt >= RD_OPT_BASIC);   // otherwise, token-buffer won't be useful
  assert(num_pass_left > 0);

  while (ok && num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits == 0);
    uint64_t size_p0 = 0;
    uint64_t distortion = 0;
    int cnt = max_count;
    // The final number of passes is not trivial to know in advance.
    const int pass_progress = remaining_progress / (2 + num_pass_left);
    remaining_progress -= pass_progress;
    VP8IteratorInit(enc, &it);
    SetLoopParams(enc, stats.q);
    if (is_last_pass) {
      ResetTokenStats(enc);
      VP8InitFilter(&it);  // don't collect stats until last pass (too costly)
    }
    VP8TBufferClear(&enc->tokens);
    do {
      VP8ModeScore info;
      VP8IteratorImport(&it, NULL);
      if (--cnt < 0) {
        FinalizeTokenProbas(proba);
        VP8CalculateLevelCosts(proba);  // refresh cost tables for rd-opt
        cnt = max_count;
      }
      VP8Decimate(&it, &info, rd_opt);
      ok = RecordTokens(&it, &info, &enc->tokens);
      if (!ok) {
        WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        break;
      }
      size_p0 += info.H;
      distortion += info.D;
      if (is_last_pass) {
        StoreSideInfo(&it);
        VP8StoreFilterStats(&it);
        VP8IteratorExport(&it);
        ok = VP8IteratorProgress(&it, pass_progress);
      }
      VP8IteratorSaveBoundary(&it);
    } while (ok && VP8IteratorNext(&it));
    if (!ok) break;

    size_p0 += enc->segment_hdr.size;
    if (stats.do_size_search) {
      uint64_t size = FinalizeTokenProbas(&enc->proba);
      size += VP8EstimateTokenSize(&enc->tokens,
                                   (const uint8_t*)proba->coeffs);
      size = (size + size_p0 + 1024) >> 11;  // -> size in bytes
      size += HEADER_SIZE_ESTIMATE;
      stats.value = (double)size;
    } else {  // compute and store PSNR
      stats.value = GetPSNR(distortion, pixel_count);
    }

#if (DEBUG_SEARCH > 0)
    printf("#%2d metric:%.1lf -> %.1lf   last_q=%.2lf q=%.2lf dq=%.2lf "
           " range:[%.1f, %.1f]\n",
           num_pass_left, stats.last_value, stats.value,
           stats.last_q, stats.q, stats.dq, stats.qmin, stats.qmax);
#endif
    if (enc->max_i4_header_bits > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits >>= 1;  // strengthen header bit limitation...
      if (is_last_pass) {
        ResetSideInfo(&it);
      }
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;   // done
    }
    if (do_search) {
      ComputeNextQ(&stats);  // Adjust q
    }
  }
  if (ok) {
    if (!stats.do_size_search) {
      FinalizeTokenProbas(&enc->proba);
    }
    ok = VP8EmitTokens(&enc->tokens, enc->parts + 0,
                       (const uint8_t*)proba->coeffs, 1);
  }
  ok = ok && WebPReportProgress(enc->pic, enc->percent + remaining_progress,
                                &enc->percent);
  return PostLoopFinalize(&it, ok);
}